

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  uint uVar1;
  int iVar2;
  int res;
  UInt32 rem;
  Byte *bufLimit_local;
  SizeT limit_local;
  CLzmaDec *p_local;
  
  bufLimit_local = (Byte *)limit;
  if ((p->checkDicSize == 0) &&
     (uVar1 = (p->prop).dicSize - p->processedPos, (ulong)uVar1 < limit - p->dicPos)) {
    bufLimit_local = (Byte *)(p->dicPos + (ulong)uVar1);
  }
  iVar2 = LzmaDec_DecodeReal_3(p,(SizeT)bufLimit_local,bufLimit);
  if ((p->checkDicSize == 0) && ((p->prop).dicSize <= p->processedPos)) {
    p->checkDicSize = (p->prop).dicSize;
  }
  return iVar2;
}

Assistant:

static int Z7_FASTCALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  if (p->checkDicSize == 0)
  {
    UInt32 rem = p->prop.dicSize - p->processedPos;
    if (limit - p->dicPos > rem)
      limit = p->dicPos + rem;
  }
  {
    int res = LZMA_DECODE_REAL(p, limit, bufLimit);
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    return res;
  }
}